

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# marginal.cc
# Opt level: O1

void MARGINAL::make_marginal<false>(data *sm,example *ec)

{
  float fVar1;
  double dVar2;
  byte bVar3;
  vw *pvVar4;
  ulong uVar5;
  __node_base_ptr p_Var6;
  _Hash_node_base *p_Var7;
  shared_ptr<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *psVar8;
  _Hashtable<unsigned_long,std::pair<unsigned_long_const,std::pair<MARGINAL::expert,MARGINAL::expert>>,std::allocator<std::pair<unsigned_long_const,std::pair<MARGINAL::expert,MARGINAL::expert>>>,std::__detail::_Select1st,std::equal_to<unsigned_long>,std::hash<unsigned_long>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>
  *this;
  features *pfVar9;
  _Hashtable<unsigned_long,std::pair<unsigned_long_const,std::pair<double,double>>,std::allocator<std::pair<unsigned_long_const,std::pair<double,double>>>,std::__detail::_Select1st,std::equal_to<unsigned_long>,std::hash<unsigned_long>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>
  *this_00;
  int iVar10;
  float *pfVar11;
  ostream *poVar12;
  __node_base_ptr p_Var13;
  mapped_type *pmVar14;
  mapped_type *pmVar15;
  long lVar16;
  uint64_t *puVar17;
  ulong uVar18;
  ulong *puVar19;
  float *pfVar20;
  features *pfVar21;
  _Hash_node_base **pp_Var22;
  features *pfVar23;
  __node_base_ptr p_Var24;
  features *pfVar25;
  ulong i;
  byte bVar26;
  float v;
  uint64_t key;
  _Hash_node_base *local_100;
  _Hashtable<unsigned_long,std::pair<unsigned_long_const,std::pair<MARGINAL::expert,MARGINAL::expert>>,std::allocator<std::pair<unsigned_long_const,std::pair<MARGINAL::expert,MARGINAL::expert>>>,std::__detail::_Select1st,std::equal_to<unsigned_long>,std::hash<unsigned_long>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>
  *local_f8;
  byte *local_f0;
  features *local_e8;
  _Hashtable<unsigned_long,std::pair<unsigned_long_const,std::pair<double,double>>,std::allocator<std::pair<unsigned_long_const,std::pair<double,double>>>,std::__detail::_Select1st,std::equal_to<unsigned_long>,std::hash<unsigned_long>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>
  *local_e0;
  features *local_d8;
  undefined8 local_d0;
  undefined4 local_c8;
  undefined4 local_c4;
  undefined4 uStack_c0;
  undefined4 local_bc;
  features *local_b8;
  features *local_b0;
  v_array<std::shared_ptr<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  *local_a8;
  uint64_t local_a0;
  _Hash_node_base *local_98;
  undefined8 local_90;
  undefined4 local_88;
  undefined4 local_84;
  undefined8 local_80;
  float local_38;
  
  bVar26 = 0;
  pvVar4 = sm->all;
  puVar17 = &(pvVar4->weights).dense_weights._weight_mask;
  if ((pvVar4->weights).sparse != false) {
    puVar17 = &(pvVar4->weights).sparse_weights._weight_mask;
  }
  local_a0 = *puVar17;
  sm->average_pred = 0.0;
  sm->net_weight = 0.0;
  sm->net_feature_weight = 0.0;
  sm->alg_loss = 0.0;
  local_f0 = (ec->super_example_predict).indices._begin;
  if (local_f0 != (ec->super_example_predict).indices._end) {
    local_b0 = (ec->super_example_predict).feature_space;
    local_b8 = sm->temp;
    local_e0 = (_Hashtable<unsigned_long,std::pair<unsigned_long_const,std::pair<double,double>>,std::allocator<std::pair<unsigned_long_const,std::pair<double,double>>>,std::__detail::_Select1st,std::equal_to<unsigned_long>,std::hash<unsigned_long>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>
                *)&sm->marginals;
    local_f8 = (_Hashtable<unsigned_long,std::pair<unsigned_long_const,std::pair<MARGINAL::expert,MARGINAL::expert>>,std::allocator<std::pair<unsigned_long_const,std::pair<MARGINAL::expert,MARGINAL::expert>>>,std::__detail::_Select1st,std::equal_to<unsigned_long>,std::hash<unsigned_long>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>
                *)&sm->expert_state;
    do {
      pfVar9 = local_b8;
      bVar3 = *local_f0;
      if (sm->id_features[bVar3] == true) {
        pfVar25 = local_b8 + bVar3;
        pfVar21 = pfVar25;
        pp_Var22 = &local_98;
        for (lVar16 = 0xd; lVar16 != 0; lVar16 = lVar16 + -1) {
          *pp_Var22 = (_Hash_node_base *)(pfVar21->values)._begin;
          pfVar21 = (features *)((long)pfVar21 + (ulong)bVar26 * -0x10 + 8);
          pp_Var22 = pp_Var22 + (ulong)bVar26 * -2 + 1;
        }
        pfVar21 = local_b0 + bVar3;
        pfVar23 = pfVar25;
        for (lVar16 = 0xc; lVar16 != 0; lVar16 = lVar16 + -1) {
          (pfVar23->values)._begin = (pfVar21->values)._begin;
          pfVar21 = (features *)((long)pfVar21 + (ulong)bVar26 * -0x10 + 8);
          pfVar23 = (features *)((long)pfVar23 + (ulong)bVar26 * -0x10 + 8);
        }
        local_b8[bVar3].sum_feat_sq = local_b0[bVar3].sum_feat_sq;
        pp_Var22 = &local_98;
        pfVar21 = local_b0 + bVar3;
        for (lVar16 = 0xc; lVar16 != 0; lVar16 = lVar16 + -1) {
          (pfVar21->values)._begin = (float *)*pp_Var22;
          pp_Var22 = pp_Var22 + (ulong)bVar26 * -2 + 1;
          pfVar21 = (features *)((long)pfVar21 + (ulong)bVar26 * -0x10 + 8);
        }
        local_b0[bVar3].sum_feat_sq = local_38;
        local_e8 = local_b0 + *local_f0;
        features::clear(local_e8);
        pfVar20 = pfVar9[bVar3].values._begin;
        pfVar11 = pfVar9[bVar3].values._end;
        if (pfVar20 != pfVar11) {
          puVar19 = (pfVar25->indicies)._begin;
          local_a8 = &local_e8->space_names;
          local_d8 = pfVar25;
          do {
            if (pfVar20 + 1 == pfVar11) {
              std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)&std::cout,"warning: id feature namespace has ",0x22);
              poVar12 = std::ostream::_M_insert<unsigned_long>((ulong)&std::cout);
              std::__ostream_insert<char,std::char_traits<char>>
                        (poVar12," features. Should be a multiple of 2",0x24);
              std::ios::widen((char)poVar12->_vptr_basic_ostream[-3] + (char)poVar12);
              std::ostream::put((char)poVar12);
              std::ostream::flush();
              iVar10 = 5;
            }
            else if ((((*pfVar20 != 1.0) || (NAN(*pfVar20))) || (pfVar20[1] != 1.0)) ||
                    (NAN(pfVar20[1]))) {
              std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)&std::cout,"warning: bad id features, must have value 1.",0x2c);
              std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x20);
              std::ostream::put(-0x20);
              std::ostream::flush();
              iVar10 = 7;
            }
            else {
              i = *puVar19 & local_a0;
              local_100 = (_Hash_node_base *)
                          ((puVar19[1] & local_a0) + (ec->super_example_predict).ft_offset);
              uVar5 = (sm->marginals)._M_h._M_bucket_count;
              uVar18 = (ulong)local_100 % uVar5;
              p_Var6 = (sm->marginals)._M_h._M_buckets[uVar18];
              p_Var13 = (__node_base_ptr)0x0;
              if ((p_Var6 != (__node_base_ptr)0x0) &&
                 (p_Var13 = p_Var6, p_Var24 = p_Var6->_M_nxt, local_100 != p_Var6->_M_nxt[1]._M_nxt)
                 ) {
                while (p_Var7 = p_Var24->_M_nxt, p_Var7 != (_Hash_node_base *)0x0) {
                  p_Var13 = (__node_base_ptr)0x0;
                  if (((ulong)p_Var7[1]._M_nxt % uVar5 != uVar18) ||
                     (p_Var13 = p_Var24, p_Var24 = p_Var7, local_100 == p_Var7[1]._M_nxt))
                  goto LAB_0023c2da;
                }
                p_Var13 = (__node_base_ptr)0x0;
              }
LAB_0023c2da:
              if ((p_Var13 == (__node_base_ptr)0x0) || (p_Var13->_M_nxt == (_Hash_node_base *)0x0))
              {
                local_90._0_4_ = sm->initial_numerator;
                local_90._4_4_ = sm->initial_denominator;
                local_98 = local_100;
                std::
                _Hashtable<unsigned_long,std::pair<unsigned_long_const,std::pair<double,double>>,std::allocator<std::pair<unsigned_long_const,std::pair<double,double>>>,std::__detail::_Select1st,std::equal_to<unsigned_long>,std::hash<unsigned_long>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>
                ::_M_emplace<std::pair<unsigned_long,std::pair<float,float>>>(local_e0,&local_98);
                if (sm->compete == true) {
                  local_c8 = 0x3f800000;
                  local_d0 = 0;
                  local_bc = 0x3f800000;
                  local_c4 = 0;
                  uStack_c0 = 0;
                  local_98 = local_100;
                  local_80 = 0x3f80000000000000;
                  local_90 = 0;
                  local_88 = 0x3f800000;
                  local_84 = 0;
                  std::
                  _Hashtable<unsigned_long,std::pair<unsigned_long_const,std::pair<MARGINAL::expert,MARGINAL::expert>>,std::allocator<std::pair<unsigned_long_const,std::pair<MARGINAL::expert,MARGINAL::expert>>>,std::__detail::_Select1st,std::equal_to<unsigned_long>,std::hash<unsigned_long>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>
                  ::
                  _M_emplace<std::pair<unsigned_long,std::pair<MARGINAL::expert,MARGINAL::expert>>>
                            (local_f8,&local_98);
                }
              }
              this_00 = local_e0;
              pmVar14 = std::__detail::
                        _Map_base<unsigned_long,_std::pair<const_unsigned_long,_std::pair<double,_double>_>,_std::allocator<std::pair<const_unsigned_long,_std::pair<double,_double>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                        ::operator[]((_Map_base<unsigned_long,_std::pair<const_unsigned_long,_std::pair<double,_double>_>,_std::allocator<std::pair<const_unsigned_long,_std::pair<double,_double>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                                      *)local_e0,(key_type *)&local_100);
              dVar2 = pmVar14->first;
              pmVar14 = std::__detail::
                        _Map_base<unsigned_long,_std::pair<const_unsigned_long,_std::pair<double,_double>_>,_std::allocator<std::pair<const_unsigned_long,_std::pair<double,_double>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                        ::operator[]((_Map_base<unsigned_long,_std::pair<const_unsigned_long,_std::pair<double,_double>_>,_std::allocator<std::pair<const_unsigned_long,_std::pair<double,_double>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                                      *)this_00,(key_type *)&local_100);
              pfVar9 = local_e8;
              v = (float)(dVar2 / pmVar14->second);
              features::push_back(local_e8,v,i);
              psVar8 = (local_d8->space_names)._begin;
              if (psVar8 != (local_d8->space_names)._end) {
                v_array<std::shared_ptr<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                ::push_back(local_a8,(shared_ptr<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                      *)((long)psVar8 +
                                        ((long)(pfVar9->values)._end - (long)(pfVar9->values)._begin
                                        ) * 8 + -0x20));
              }
              this = local_f8;
              if (sm->compete == true) {
                pmVar15 = std::__detail::
                          _Map_base<unsigned_long,_std::pair<const_unsigned_long,_std::pair<MARGINAL::expert,_MARGINAL::expert>_>,_std::allocator<std::pair<const_unsigned_long,_std::pair<MARGINAL::expert,_MARGINAL::expert>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                          ::operator[]((_Map_base<unsigned_long,_std::pair<const_unsigned_long,_std::pair<MARGINAL::expert,_MARGINAL::expert>_>,_std::allocator<std::pair<const_unsigned_long,_std::pair<MARGINAL::expert,_MARGINAL::expert>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                                        *)local_f8,(key_type *)&local_100);
                fVar1 = (pmVar15->first).weight;
                sm->average_pred = v * fVar1 + sm->average_pred;
                sm->net_weight = fVar1 + sm->net_weight;
                pmVar15 = std::__detail::
                          _Map_base<unsigned_long,_std::pair<const_unsigned_long,_std::pair<MARGINAL::expert,_MARGINAL::expert>_>,_std::allocator<std::pair<const_unsigned_long,_std::pair<MARGINAL::expert,_MARGINAL::expert>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                          ::operator[]((_Map_base<unsigned_long,_std::pair<const_unsigned_long,_std::pair<MARGINAL::expert,_MARGINAL::expert>_>,_std::allocator<std::pair<const_unsigned_long,_std::pair<MARGINAL::expert,_MARGINAL::expert>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                                        *)this,(key_type *)&local_100);
                sm->net_feature_weight = (pmVar15->second).weight + sm->net_feature_weight;
              }
              iVar10 = 0;
              pfVar25 = local_d8;
            }
            if ((iVar10 != 7) && (iVar10 != 0)) break;
            pfVar20 = pfVar20 + 2;
            puVar19 = puVar19 + 2;
            pfVar11 = (pfVar25->values)._end;
          } while (pfVar20 != pfVar11);
        }
      }
      local_f0 = local_f0 + 1;
    } while (local_f0 != (ec->super_example_predict).indices._end);
  }
  return;
}

Assistant:

void make_marginal(data& sm, example& ec)
{
  uint64_t mask = sm.all->weights.mask();
  float label = ec.l.simple.label;
  vw& all = *sm.all;
  sm.alg_loss = 0.;
  sm.net_weight = 0.;
  sm.net_feature_weight = 0.;
  sm.average_pred = 0.;

  for (example::iterator i = ec.begin(); i != ec.end(); ++i)
  {
    namespace_index n = i.index();
    if (sm.id_features[n])
    {
      std::swap(sm.temp[n], *i);
      features& f = *i;
      f.clear();
      for (features::iterator j = sm.temp[n].begin(); j != sm.temp[n].end(); ++j)
      {
        float first_value = j.value();
        uint64_t first_index = j.index() & mask;
        if (++j == sm.temp[n].end())
        {
          cout << "warning: id feature namespace has " << sm.temp[n].size() << " features. Should be a multiple of 2"
               << endl;
          break;
        }
        float second_value = j.value();
        uint64_t second_index = j.index() & mask;
        if (first_value != 1. || second_value != 1.)
        {
          cout << "warning: bad id features, must have value 1." << endl;
          continue;
        }
        uint64_t key = second_index + ec.ft_offset;
        if (sm.marginals.find(key) == sm.marginals.end())  // need to initialize things.
        {
          sm.marginals.insert(make_pair(key, make_pair(sm.initial_numerator, sm.initial_denominator)));
          if (sm.compete)
          {
            expert e = {0, 0, 1.};
            sm.expert_state.insert(make_pair(key, make_pair(e, e)));
          }
        }
        float marginal_pred = (float)(sm.marginals[key].first / sm.marginals[key].second);
        f.push_back(marginal_pred, first_index);
        if (!sm.temp[n].space_names.empty())
          f.space_names.push_back(sm.temp[n].space_names[2 * (f.size() - 1)]);

        if (sm.compete)  // compute the prediction from the marginals using the weights
        {
          float weight = sm.expert_state[key].first.weight;
          sm.average_pred += weight * marginal_pred;
          sm.net_weight += weight;
          sm.net_feature_weight += sm.expert_state[key].second.weight;
          if (is_learn)
            sm.alg_loss += weight * all.loss->getLoss(all.sd, marginal_pred, label);
        }
      }
    }
  }
}